

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

void __thiscall testing::Matcher<wchar_t>::Matcher(Matcher<wchar_t> *this,wchar_t value)

{
  linked_ptr<const_testing::MatcherInterface<wchar_t>_> local_38;
  
  (this->super_MatcherBase<wchar_t>).impl_.value_ = (MatcherInterface<wchar_t> *)0x0;
  (this->super_MatcherBase<wchar_t>).impl_.link_.next_ =
       &(this->super_MatcherBase<wchar_t>).impl_.link_;
  (this->super_MatcherBase<wchar_t>)._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001d9208;
  local_38.value_ = (MatcherInterface<wchar_t> *)operator_new(0x10);
  ((local_38.value_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_001d93c8;
  *(wchar_t *)&local_38.value_[1].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       value;
  local_38.link_.next_ = &local_38.link_;
  internal::linked_ptr<const_testing::MatcherInterface<wchar_t>_>::operator=
            (&(this->super_MatcherBase<wchar_t>).impl_,&local_38);
  internal::linked_ptr<const_testing::MatcherInterface<wchar_t>_>::~linked_ptr(&local_38);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }